

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderCsc::LossyDctEncoderCsc
          (LossyDctEncoderCsc *this,float quantBaseError,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsR,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsG,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsB,char *packedAc,
          char *packedDc,unsigned_short *toNonlinear,int width,int height,PixelType typeR,
          PixelType typeG,PixelType typeB)

{
  vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *this_00;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  *this_01;
  
  LossyDctEncoderBase::LossyDctEncoderBase
            (&this->super_LossyDctEncoderBase,quantBaseError,packedAc,packedDc,toNonlinear,width,
             height);
  (this->super_LossyDctEncoderBase)._vptr_LossyDctEncoderBase =
       (_func_int **)&PTR__LossyDctEncoderBase_02f9cb80;
  this_00 = &(this->super_LossyDctEncoderBase)._type;
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back(this_00,&typeR);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back(this_00,&typeG);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back(this_00,&typeB);
  this_01 = &(this->super_LossyDctEncoderBase)._rowPtrs;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsR);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsG);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsB);
  return;
}

Assistant:

LossyDctEncoderCsc
        (float quantBaseError,
         std::vector<const char *> &rowPtrsR,
         std::vector<const char *> &rowPtrsG,
         std::vector<const char *> &rowPtrsB,
         char *packedAc,
         char *packedDc,
         const unsigned short *toNonlinear,
         int width,
         int height,
         PixelType typeR,
         PixelType typeG,
         PixelType typeB)
    :
        LossyDctEncoderBase
            (quantBaseError, packedAc, packedDc, toNonlinear, width, height)
    {
        _type.push_back(typeR);
        _type.push_back(typeG);
        _type.push_back(typeB);

        _rowPtrs.push_back(rowPtrsR);
        _rowPtrs.push_back(rowPtrsG);
        _rowPtrs.push_back(rowPtrsB);
    }